

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O3

void __thiscall amrex::MLEBABecLap::averageDownCoeffs(MLEBABecLap *this)

{
  pointer pVVar1;
  pointer pVVar2;
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *a;
  Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_> *b;
  long lVar3;
  bool bVar4;
  pointer piVar5;
  long lVar6;
  long lVar7;
  MLEBABecLap *pMVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> local_60;
  MLEBABecLap *local_48;
  long local_40;
  long local_38;
  
  uVar11 = (ulong)(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_amr_levels;
  local_48 = this;
  if (1 < (long)uVar11) {
    lVar7 = uVar11 * 0x18;
    do {
      pVVar1 = (this->m_a_coeffs).
               super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
               .
               super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pVVar2 = (this->m_b_coeffs).
               super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
               .
               super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      GetVecOfPtrs<amrex::MultiFab>
                (&local_60,
                 (this->m_eb_b_coeffs).
                 super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                 .
                 super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      iVar10 = (int)(uVar11 - 1);
      averageDownCoeffsSameAmrLevel
                (this,iVar10,
                 (Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                 ((long)&pVVar1[-1].super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                         super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> +
                 lVar7),(Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                         *)((long)&pVVar2[-1].
                                   super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                   .
                                   super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                           + lVar7),&local_60);
      if (local_60.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                        .super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_60.
                              super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.
                              super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      this = local_48;
      averageDownCoeffsToCoarseAmrLevel(local_48,iVar10);
      bVar4 = 2 < uVar11;
      uVar11 = uVar11 - 1;
      lVar7 = lVar7 + -0x18;
    } while (bVar4);
  }
  a = (this->m_a_coeffs).
      super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
      .
      super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start;
  b = (this->m_b_coeffs).
      super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
      .
      super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start;
  GetVecOfPtrs<amrex::MultiFab>
            (&local_60,
             (this->m_eb_b_coeffs).
             super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
             .
             super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  averageDownCoeffsSameAmrLevel(this,0,a,b,&local_60);
  if (local_60.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  iVar10 = (local_48->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_amr_levels;
  if (0 < iVar10) {
    piVar5 = (local_48->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_mg_levels.
             super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar7 = 0;
    pMVar8 = local_48;
    do {
      local_40 = lVar7;
      if (0 < piVar5[lVar7]) {
        lVar6 = 0;
        local_38 = 0;
        do {
          lVar9 = local_38 * 200;
          lVar12 = 0;
          do {
            lVar3 = *(long *)&(pMVar8->m_b_coeffs).
                              super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                              .
                              super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar7].
                              super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                              .
                              super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
            ;
            local_60.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
            super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
            super__Vector_impl_data._0_12_ =
                 Geometry::periodicity
                           ((Geometry *)
                            (*(long *)&(pMVar8->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp
                                       .m_geom.
                                       super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                       .
                                       super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar7].
                                       super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                       .
                                       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                            + lVar9));
            FabArray<amrex::FArrayBox>::FillBoundary<double>
                      ((FabArray<amrex::FArrayBox> *)(lVar3 + lVar6 + lVar12),
                       (Periodicity *)&local_60,false);
            lVar12 = lVar12 + 0x180;
            pMVar8 = local_48;
          } while (lVar12 != 0x480);
          local_38 = local_38 + 1;
          piVar5 = (local_48->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_mg_levels.
                   super_vector<int,_std::allocator<int>_>.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          lVar6 = lVar6 + 0x480;
        } while (local_38 < piVar5[local_40]);
        iVar10 = (local_48->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_amr_levels;
      }
      lVar7 = local_40 + 1;
    } while (lVar7 < iVar10);
  }
  return;
}

Assistant:

void
MLEBABecLap::averageDownCoeffs ()
{
    for (int amrlev = m_num_amr_levels-1; amrlev > 0; --amrlev)
    {
        auto& fine_a_coeffs = m_a_coeffs[amrlev];
        auto& fine_b_coeffs = m_b_coeffs[amrlev];

        averageDownCoeffsSameAmrLevel(amrlev, fine_a_coeffs, fine_b_coeffs,
                                      amrex::GetVecOfPtrs(m_eb_b_coeffs[0]));
        averageDownCoeffsToCoarseAmrLevel(amrlev);
    }

    averageDownCoeffsSameAmrLevel(0, m_a_coeffs[0], m_b_coeffs[0],
                                  amrex::GetVecOfPtrs(m_eb_b_coeffs[0]));

    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev) {
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev) {
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                m_b_coeffs[amrlev][mglev][idim].FillBoundary(m_geom[amrlev][mglev].periodicity());
            }
        }
    }
}